

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibLoaderFactory.h
# Opt level: O2

shared_ptr<util::LibraryLoader> util::LibLoaderFactory::getLoader(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<util::LibraryLoader> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<util::UnixLibLoader>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_LibraryLoader = local_18;
  in_RDI[1]._vptr_LibraryLoader = (_func_int **)_Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<util::LibraryLoader>)
         sVar2.super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<LibraryLoader> getLoader() {
#ifdef WIN32
    return std::make_shared<WindowsLibLoader>();
#else
    return std::make_shared<UnixLibLoader>();
#endif
  }